

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmListFileBacktrace __thiscall
TargetPropertyEntryGenex::GetBacktrace(TargetPropertyEntryGenex *this)

{
  cmCompiledGeneratorExpression *pcVar1;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar2;
  pointer *ppSVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  cmListFileBacktrace cVar5;
  cmListFileBacktrace cVar6;
  
  pcVar1 = (this->ge)._M_t.
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
  _Var4._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(pcVar1->Backtrace).TopEntry;
  (in_RDI->field_0).Bottom.State = (cmState *)_Var4._M_pi;
  pcVar2 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(pcVar1->Backtrace).TopEntry + 8))
           ->_M_pi;
  (in_RDI->field_0).Bottom.Position.Tree = pcVar2;
  if (pcVar2 != (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      ppSVar3 = (pointer *)((long)&pcVar2->Data + 8);
      *(int *)ppSVar3 = *(int *)ppSVar3 + 1;
      cVar5.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      cVar5.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           in_RDI;
      return (cmListFileBacktrace)
             cVar5.TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    ppSVar3 = (pointer *)((long)&pcVar2->Data + 8);
    *(int *)ppSVar3 = *(int *)ppSVar3 + 1;
    UNLOCK();
  }
  cVar6.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  cVar6.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (cmListFileBacktrace)
         cVar6.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace GetBacktrace() const override
  {
    return this->ge->GetBacktrace();
  }